

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

bool __thiscall cs222::Parser::hasNext(Parser *this)

{
  bool bVar1;
  unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_> local_20;
  Parser *local_18;
  Parser *this_local;
  
  local_18 = this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->nextInstruction);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    (**this->_vptr_Parser)(&local_20);
    std::unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_>::operator=
              (&this->nextInstruction,&local_20);
    std::unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_>::~unique_ptr
              (&local_20);
    this_local._7_1_ = std::operator!=(&this->nextInstruction,(nullptr_t)0x0);
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::hasNext()
    {
        if (nextInstruction) {
            return true;
        }
        nextInstruction = next();
        return nextInstruction != nullptr;
    }